

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O3

LValue * __thiscall
slang::ast::MemberAccessExpression::evalLValueImpl
          (LValue *__return_storage_ptr__,MemberAccessExpression *this,EvalContext *context)

{
  SymbolKind SVar1;
  Symbol *pSVar2;
  SourceLocation SVar3;
  bool bVar4;
  bitwidth_t bVar5;
  Type *pTVar6;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *val;
  ConstantRange range;
  variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  *__v;
  variant_alternative_t<9UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar7;
  Diagnostic *this_00;
  uint index;
  Type *this_01;
  ConstantValue cv;
  LValue lval;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_1e0;
  _Variant_storage<false,_std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
  local_1b8;
  
  Expression::evalLValue((LValue *)&local_1b8,this->value_,context);
  if (local_1b8._M_index == '\0') {
LAB_004b6c83:
    *(__index_type *)
     ((long)&(__return_storage_ptr__->value).
             super__Variant_base<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
             .
             super__Move_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
             .
             super__Copy_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
             .
             super__Move_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
             .
             super__Copy_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
             .
             super__Variant_storage_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
     + 0x180) = '\0';
    goto LAB_004b6cf3;
  }
  pSVar2 = this->member;
  pTVar6 = (this->value_->type).ptr;
  this_01 = pTVar6->canonical;
  if (this_01 == (Type *)0x0) {
    Type::resolveCanonical(pTVar6);
    this_01 = pTVar6->canonical;
  }
  pTVar6 = this_01->canonical;
  if (pTVar6 == (Type *)0x0) {
    Type::resolveCanonical(this_01);
    pTVar6 = this_01->canonical;
  }
  SVar1 = (pTVar6->super_Symbol).kind;
  if (SVar1 == UnpackedUnionType) {
    bVar4 = Type::isTaggedUnion(this_01);
    if (bVar4) {
      __v = &LValue::resolve((LValue *)&local_1b8)->value;
      pvVar7 = std::
               get<9ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                         (__v);
      if (((pvVar7->ptr->activeMember).super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>._M_engaged != true) ||
         (index = (pvVar7->ptr->activeMember).super__Optional_base<unsigned_int,_true,_true>.
                  _M_payload.super__Optional_payload_base<unsigned_int>._M_payload._M_value,
         index != *(uint *)&pSVar2[5].parentScope)) {
        this_00 = EvalContext::addDiag
                            (context,(DiagCode)0x1c000c,(this->super_Expression).sourceRange);
        Diagnostic::operator<<(this_00,this->member->name);
        goto LAB_004b6c83;
      }
    }
    else {
      index = *(uint *)&pSVar2[5].parentScope;
    }
    Type::getDefaultValue((ConstantValue *)&local_1e0,(this->super_Expression).type.ptr);
    LValue::addIndex((LValue *)&local_1b8,index,(ConstantValue *)&local_1e0);
LAB_004b6cdc:
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage(&local_1e0);
  }
  else {
    if (SVar1 == PackedUnionType) {
      LValue::load((ConstantValue *)&local_1e0,(LValue *)&local_1b8);
      val = std::
            get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                      ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                        *)&local_1e0);
      bVar4 = checkPackedUnionTag((Type *)(ulong)this_01[2].super_Symbol.kind,val,
                                  *(uint32_t *)&pSVar2[5].parentScope,context,
                                  (this->super_Expression).sourceRange,this->member->name);
      if (!bVar4) {
        *(__index_type *)
         ((long)&(__return_storage_ptr__->value).
                 super__Variant_base<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                 .
                 super__Move_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                 .
                 super__Copy_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                 .
                 super__Move_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                 .
                 super__Copy_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                 .
                 super__Variant_storage_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
         + 0x180) = '\0';
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage(&local_1e0);
        goto LAB_004b6cf3;
      }
      bVar5 = Type::getBitWidth((this->super_Expression).type.ptr);
      range.left = bVar5 - 1;
      range.right = 0;
      LValue::addBitSlice((LValue *)&local_1b8,range);
      goto LAB_004b6cdc;
    }
    if (SVar1 == UnpackedStructType) {
      local_1e0._M_index = '\0';
      LValue::addIndex((LValue *)&local_1b8,*(int32_t *)&pSVar2[5].parentScope,
                       (ConstantValue *)&local_1e0);
      goto LAB_004b6cdc;
    }
    SVar3 = pSVar2[5].location;
    bVar5 = Type::getBitWidth((this->super_Expression).type.ptr);
    LValue::addBitSlice((LValue *)&local_1b8,
                        (ConstantRange)((ulong)((SVar3._0_4_ + bVar5) - 1) | (long)SVar3 << 0x20));
  }
  std::__detail::__variant::
  _Move_ctor_base<false,_std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>::
  _Move_ctor_base((_Move_ctor_base<false,_std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                   *)__return_storage_ptr__,
                  (_Move_ctor_base<false,_std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                   *)&local_1b8);
LAB_004b6cf3:
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>::
  ~_Variant_storage(&local_1b8);
  return __return_storage_ptr__;
}

Assistant:

LValue MemberAccessExpression::evalLValueImpl(EvalContext& context) const {
    LValue lval = value().evalLValue(context);
    if (!lval)
        return nullptr;

    auto& field = member.as<FieldSymbol>();
    auto& valueType = value().type->getCanonicalType();
    if (valueType.isUnpackedStruct()) {
        lval.addIndex((int32_t)field.fieldIndex, nullptr);
    }
    else if (valueType.isUnpackedUnion()) {
        if (valueType.isTaggedUnion()) {
            auto target = lval.resolve();
            SLANG_ASSERT(target);

            if (target->unionVal()->activeMember != field.fieldIndex) {
                context.addDiag(diag::ConstEvalTaggedUnion, sourceRange) << member.name;
                return nullptr;
            }
        }
        lval.addIndex((int32_t)field.fieldIndex, type->getDefaultValue());
    }
    else if (valueType.isPackedUnion()) {
        auto cv = lval.load();
        if (!checkPackedUnionTag(valueType, cv.integer(), field.fieldIndex, context, sourceRange,
                                 member.name)) {
            return nullptr;
        }

        int32_t width = (int32_t)type->getBitWidth();
        lval.addBitSlice({width - 1, 0});
    }
    else {
        int32_t io = (int32_t)field.bitOffset;
        int32_t width = (int32_t)type->getBitWidth();
        lval.addBitSlice({width + io - 1, io});
    }

    return lval;
}